

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimProfile(Gia_Man_t *pGia)

{
  int iVar1;
  int nWords;
  uint uVar2;
  Vec_Wrd_t *vSims;
  uint uVar3;
  int nC1s;
  int nC0s;
  uint local_30;
  uint local_2c;
  
  vSims = Gia_ManSimPatSim(pGia);
  nWords = vSims->nSize / pGia->nObjs;
  local_2c = 0;
  local_30 = 0;
  uVar2 = Gia_ManSimPatHashPatterns(pGia,nWords,vSims,(int *)&local_2c,(int *)&local_30);
  iVar1 = pGia->vCis->nSize;
  uVar3 = iVar1 + pGia->nObjs + ~(pGia->vCos->nSize + iVar1);
  printf("Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n"
         ,((double)(int)uVar2 * 100.0) / (double)(int)uVar3,(ulong)(uint)(nWords << 6),(ulong)uVar2,
         (ulong)uVar3,(ulong)local_2c,(ulong)local_30);
  if (vSims->pArray != (word *)0x0) {
    free(vSims->pArray);
  }
  free(vSims);
  return;
}

Assistant:

void Gia_ManSimProfile( Gia_Man_t * pGia )
{
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( pGia );
    int nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(pGia);
    int nC0s = 0, nC1s = 0, nUnique = Gia_ManSimPatHashPatterns( pGia, nWords, vSims, &nC0s, &nC1s );
    printf( "Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n", 
        64*nWords, nUnique, 100.0*nUnique/Gia_ManCandNum(pGia), Gia_ManCandNum(pGia), nC0s, nC1s );
    Vec_WrdFree( vSims );
}